

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PushComment(XMLPrinter *this,char *comment)

{
  XMLPrinter *in_RSI;
  XMLPrinter *in_RDI;
  
  SealElementIfJustOpened(in_RSI);
  if (((in_RDI->_textDepth < 0) && ((in_RDI->_firstElement & 1U) == 0)) &&
     ((in_RDI->_compactMode & 1U) == 0)) {
    Print(in_RDI,"\n");
    (*(in_RDI->super_XMLVisitor)._vptr_XMLVisitor[0xc])(in_RDI,(ulong)(uint)in_RDI->_depth);
  }
  in_RDI->_firstElement = false;
  Print(in_RDI,"<!--%s-->",in_RSI);
  return;
}

Assistant:

void XMLPrinter::PushComment( const char* comment )
{
    SealElementIfJustOpened();
    if ( _textDepth < 0 && !_firstElement && !_compactMode) {
        Print( "\n" );
        PrintSpace( _depth );
    }
    _firstElement = false;
    Print( "<!--%s-->", comment );
}